

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# M68KDisassembler.c
# Opt level: O3

void d68010_movec(m68k_info *info)

{
  ushort uVar1;
  float fVar2;
  ushort uVar3;
  float fVar4;
  float fVar5;
  ulong uVar6;
  uint uVar7;
  
  if ((info->type & 0x1e) != 0) {
    uVar7 = info->pc;
    uVar6 = (ulong)(uVar7 - (int)info->baseAddress & info->address_mask);
    if (info->code_len < uVar6 + 2) {
      info->pc = uVar7 + 2;
      MCInst_setOpcode(info->inst,0x11b);
      (info->extension).op_count = '\x02';
      (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
      (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x0;
      fVar4 = 0.0;
      uVar7 = 0xaaaa;
    }
    else {
      uVar1 = *(ushort *)(info->code + uVar6) << 8;
      uVar3 = *(ushort *)(info->code + uVar6) >> 8;
      info->pc = uVar7 + 2;
      MCInst_setOpcode(info->inst,0x11b);
      (info->extension).op_count = '\x02';
      (info->extension).op_size.type = M68K_SIZE_TYPE_CPU;
      (info->extension).op_size.field_1 = (anon_union_4_2_f1e43d3e_for_m68k_op_size_1)0x0;
      uVar7 = (uint)(uVar1 | uVar3);
      uVar3 = uVar1 & 0xfff | uVar3;
      switch(uVar3) {
      case 0:
        fVar4 = 3.92364e-44;
        break;
      case 1:
        fVar4 = 4.06377e-44;
        break;
      case 2:
        fVar4 = 4.48416e-44;
        break;
      case 3:
        fVar4 = 5.04467e-44;
        break;
      case 4:
        fVar4 = 5.1848e-44;
        break;
      case 5:
        fVar4 = 5.32493e-44;
        break;
      case 6:
        fVar4 = 5.46506e-44;
        break;
      case 7:
        fVar4 = 5.60519e-44;
        break;
      default:
        switch(uVar3) {
        case 0x800:
          fVar4 = 4.2039e-44;
          break;
        case 0x801:
          fVar4 = 4.34403e-44;
          break;
        case 0x802:
          fVar4 = 4.62428e-44;
          break;
        case 0x803:
          fVar4 = 4.76441e-44;
          break;
        case 0x804:
          fVar4 = 4.90454e-44;
          break;
        case 0x805:
          fVar4 = 5.74532e-44;
          break;
        case 0x806:
          fVar4 = 5.88545e-44;
          break;
        case 0x807:
          fVar4 = 6.02558e-44;
          break;
        default:
          fVar4 = 0.0;
        }
      }
    }
    fVar5 = (float)((uVar7 >> 0xc & 7) + 1 + (uint)(0x7fff < uVar7) * 8);
    fVar2 = fVar4;
    if ((info->ir & 2) == 0) {
      fVar2 = fVar5;
      fVar5 = fVar4;
    }
    (info->extension).operands[0].field_0.reg = (m68k_reg)fVar5;
    (info->extension).operands[1].field_0.simm = fVar2;
    return;
  }
  build_imm(info,0,info->ir);
  return;
}

Assistant:

static void d68010_movec(m68k_info *info)
{
	uint extension;
	m68k_reg reg;
	cs_m68k* ext;
	cs_m68k_op* op0;
	cs_m68k_op* op1;


	LIMIT_CPU_TYPES(info, M68010_PLUS);

	extension = read_imm_16(info);
	reg = M68K_REG_INVALID;

	ext = build_init_op(info, M68K_INS_MOVEC, 2, 0);

	op0 = &ext->operands[0];
	op1 = &ext->operands[1];

	switch (extension & 0xfff) {
		case 0x000: reg = M68K_REG_SFC; break;
		case 0x001: reg = M68K_REG_DFC; break;
		case 0x800: reg = M68K_REG_USP; break;
		case 0x801: reg = M68K_REG_VBR; break;
		case 0x002: reg = M68K_REG_CACR; break;
		case 0x802: reg = M68K_REG_CAAR; break;
		case 0x803: reg = M68K_REG_MSP; break;
		case 0x804: reg = M68K_REG_ISP; break;
		case 0x003: reg = M68K_REG_TC; break;
		case 0x004: reg = M68K_REG_ITT0; break;
		case 0x005: reg = M68K_REG_ITT1; break;
		case 0x006: reg = M68K_REG_DTT0; break;
		case 0x007: reg = M68K_REG_DTT1; break;
		case 0x805: reg = M68K_REG_MMUSR; break;
		case 0x806: reg = M68K_REG_URP; break;
		case 0x807: reg = M68K_REG_SRP; break;
	}

	if (BIT_1(info->ir)) {
		op0->reg = (BIT_F(extension) ? M68K_REG_A0 : M68K_REG_D0) + ((extension >> 12) & 7);
		op1->reg = reg;
	} else {
		op0->reg = reg;
		op1->reg = (BIT_F(extension) ? M68K_REG_A0 : M68K_REG_D0) + ((extension >> 12) & 7);
	}
}